

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item_group.cpp
# Opt level: O1

size_t __thiscall mpt::item_group::clear(item_group *this,metatype *ref)

{
  item_array<mpt::metatype> *this_00;
  metatype *pmVar1;
  reference<mpt::content<mpt::item<mpt::metatype>_>_> in_RAX;
  content<mpt::item<mpt::metatype>_> *d;
  ulong uVar2;
  item<mpt::metatype> *it;
  content<mpt::item<mpt::metatype>_> *pcVar3;
  content<mpt::item<mpt::metatype>_> *pcVar4;
  long lVar5;
  size_t sVar6;
  unique_array<mpt::item<mpt::metatype>_> uVar7;
  unique_array<mpt::item<mpt::metatype>_> local_38;
  
  this_00 = &this->_items;
  pcVar4 = (this->_items).super_unique_array<mpt::item<mpt::metatype>_>._ref._ref;
  if (ref == (metatype *)0x0) {
    sVar6 = 0;
    if (pcVar4 != (content<mpt::item<mpt::metatype>_> *)0x0) {
      sVar6 = (size_t)(0x1f < (pcVar4->super_buffer)._used);
    }
    local_38._ref._ref =
         (reference<mpt::content<mpt::item<mpt::metatype>_>_>)
         (reference<mpt::content<mpt::item<mpt::metatype>_>_>)in_RAX._ref;
    unique_array<mpt::item<mpt::metatype>_>::unique_array(&local_38,-1);
    uVar7._ref._ref = local_38._ref._ref;
    if (local_38._ref._ref !=
        (reference<mpt::content<mpt::item<mpt::metatype>_>_>)
        (this_00->super_unique_array<mpt::item<mpt::metatype>_>)._ref._ref) {
      if (local_38._ref._ref == (content<mpt::item<mpt::metatype>_> *)0x0) {
        uVar7._ref._ref =
             (reference<mpt::content<mpt::item<mpt::metatype>_>_>)
             (content<mpt::item<mpt::metatype>_> *)0x0;
      }
      else {
        lVar5 = (**(code **)(*(long *)local_38._ref._ref + 0x10))(local_38._ref._ref);
        if (lVar5 == 0) {
          uVar7._ref._ref =
               (reference<mpt::content<mpt::item<mpt::metatype>_>_>)
               (content<mpt::item<mpt::metatype>_> *)0x0;
        }
      }
      pcVar4 = (this_00->super_unique_array<mpt::item<mpt::metatype>_>)._ref._ref;
      if (pcVar4 != (content<mpt::item<mpt::metatype>_> *)0x0) {
        (*(pcVar4->super_buffer)._vptr_buffer[1])();
      }
      (this_00->super_unique_array<mpt::item<mpt::metatype>_>)._ref._ref =
           (content<mpt::item<mpt::metatype>_> *)uVar7._ref._ref;
    }
    if (local_38._ref._ref != (content<mpt::item<mpt::metatype>_> *)0x0) {
      (**(code **)(*(long *)local_38._ref._ref + 8))();
    }
  }
  else {
    pcVar3 = pcVar4 + 1;
    if (pcVar4 == (content<mpt::item<mpt::metatype>_> *)0x0) {
      pcVar4 = (content<mpt::item<mpt::metatype>_> *)0x0;
      pcVar3 = (content<mpt::item<mpt::metatype>_> *)0x0;
    }
    else {
      pcVar4 = (content<mpt::item<mpt::metatype>_> *)
               ((long)&(pcVar3->super_buffer)._vptr_buffer +
               ((pcVar4->super_buffer)._used & 0xffffffffffffffe0));
    }
    if (pcVar3 == pcVar4) {
      lVar5 = 0;
      sVar6 = 0;
    }
    else {
      sVar6 = 0;
      lVar5 = 0;
      do {
        pmVar1 = (metatype *)(pcVar3->super_buffer)._vptr_buffer;
        if (pmVar1 == (metatype *)0x0) {
          lVar5 = lVar5 + 1;
        }
        else if (pmVar1 == ref) {
          (*(pmVar1->super_convertable)._vptr_convertable[1])();
          (pcVar3->super_buffer)._vptr_buffer = (_func_int **)0x0;
          sVar6 = sVar6 + 1;
        }
        pcVar3 = pcVar3 + 1;
      } while (pcVar3 != pcVar4);
    }
    pcVar4 = (this_00->super_unique_array<mpt::item<mpt::metatype>_>)._ref._ref;
    if (pcVar4 == (content<mpt::item<mpt::metatype>_> *)0x0) {
      uVar2 = 0;
    }
    else {
      uVar2 = (pcVar4->super_buffer)._used >> 6;
    }
    if ((long)uVar2 < (long)(lVar5 + sVar6)) {
      item_array<mpt::metatype>::compact(this_00);
    }
  }
  return sVar6;
}

Assistant:

size_t item_group::clear(const metatype *ref)
{
	long remove = 0;
	if (!ref) {
		remove = _items.length();
		_items = item_array<metatype>();
		return remove ? true : false;
	}
	long empty = 0;
	for (auto &it : _items) {
		metatype *curr = it.instance();
		if (!curr) {
			++empty;
			continue;
		}
		if (curr != ref) {
			continue;
		}
		it.set_instance(nullptr);
		++remove;
	}
	if ((remove + empty) > _items.length()/2) {
		_items.compact();
	}
	return remove;
}